

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

Var Js::JavascriptArray::MapObjectHelper<unsigned_long>
              (RecyclableObject *obj,unsigned_long length,unsigned_long start,
              RecyclableObject *newObj,JavascriptArray *newArr,bool isBuiltinArrayCtor,
              RecyclableObject *callBackFn,Var thisArg,ScriptContext *scriptContext)

{
  bool bVar1;
  ThreadContext *this;
  BOOL BVar2;
  uint uVar3;
  Var pvVar4;
  JavascriptMethod p_Var5;
  Var pvVar6;
  Var aItem;
  bool bVar7;
  BigIndex idxDest;
  BigIndex index;
  BigIndex local_98;
  BigIndex local_88;
  unsigned_long local_78;
  JavascriptArray *local_70;
  undefined1 local_68 [8];
  JsReentLock jsReentLock;
  
  local_68 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_68)->noJsReentrancy;
  ((ThreadContext *)local_68)->noJsReentrancy = true;
  local_78 = length;
  jsReentLock._24_8_ = obj;
  JsReentLock::setObjectForMutation((JsReentLock *)local_68,obj);
  bVar7 = newArr == (JavascriptArray *)0x0;
  local_70 = newArr;
  for (; start < local_78; start = start + 1) {
    *(undefined1 *)((long)local_68 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    BVar2 = JavascriptOperators::HasItem((RecyclableObject *)jsReentLock._24_8_,start);
    JsReentLock::MutateArrayObject((JsReentLock *)local_68);
    *(bool *)((long)local_68 + 0x108) = true;
    if (BVar2 != 0) {
      *(undefined1 *)((long)local_68 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      pvVar4 = JavascriptOperators::GetItem
                         ((RecyclableObject *)jsReentLock._24_8_,start,scriptContext);
      this = scriptContext->threadContext;
      bVar1 = this->reentrancySafeOrHandled;
      this->reentrancySafeOrHandled = true;
      ThreadContext::CheckAndResetReentrancySafeOrHandled(this);
      ThreadContext::AssertJsReentrancy(scriptContext->threadContext);
      p_Var5 = RecyclableObject::GetEntryPoint(callBackFn);
      CheckIsExecutable(callBackFn,p_Var5);
      p_Var5 = RecyclableObject::GetEntryPoint(callBackFn);
      pvVar6 = JavascriptNumber::ToVar(start,scriptContext);
      aItem = (Var)0x0;
      pvVar4 = (*p_Var5)(callBackFn,(CallInfo)callBackFn,0x2000004,0,0,0,0,0x2000004,thisArg,pvVar4,
                         pvVar6,jsReentLock._24_8_);
      this->reentrancySafeOrHandled = bVar1;
      JsReentLock::MutateArrayObject((JsReentLock *)local_68);
      newArr = local_70;
      *(bool *)((long)local_68 + 0x108) = true;
      if (bVar7 || !isBuiltinArrayCtor) {
        *(undefined1 *)((long)local_68 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        BigIndex::BigIndex(&local_98,start);
        idxDest.bigIndex = (uint64)pvVar4;
        idxDest._0_8_ = local_98.bigIndex;
        uVar3 = SetArrayLikeObjects((JavascriptArray *)newObj,
                                    (RecyclableObject *)(ulong)local_98.index,idxDest,aItem);
        BigIndex::BigIndex(&local_88,start);
        index.bigIndex = (uint64)aItem;
        index._0_8_ = local_88.bigIndex;
        ThrowErrorOnFailure((JavascriptArray *)(ulong)uVar3,(BOOL)scriptContext,
                            (ScriptContext *)(ulong)local_88.index,index);
        JsReentLock::MutateArrayObject((JsReentLock *)local_68);
        *(bool *)((long)local_68 + 0x108) = true;
      }
      else {
        (*(local_70->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
          super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                  (local_70,start & 0xffffffff,pvVar4,0);
      }
    }
  }
  bVar7 = IsNonES5Array(newObj);
  if (bVar7) {
    (*(newArr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject
      .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x74])(newArr);
  }
  *(undefined1 *)((long)local_68 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return newObj;
}

Assistant:

Var JavascriptArray::MapObjectHelper(RecyclableObject* obj, T length, T start, RecyclableObject* newObj, JavascriptArray* newArr,
        bool isBuiltinArrayCtor, RecyclableObject* callBackFn, Var thisArg, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, obj);

        CallInfo callBackFnInfo = CallInfo(CallFlags_Value, 4);
        Var element = nullptr;
        Var mappedValue = nullptr;

        for (T k = start; k < length; k++)
        {
            JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(obj, k));
            if (hasItem)
            {
                JS_REENTRANT(jsReentLock,
                    element = JavascriptOperators::GetItem(obj, k, scriptContext);
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        mappedValue = CALL_FUNCTION(scriptContext->GetThreadContext(), callBackFn, callBackFnInfo, thisArg,
                                element,
                                JavascriptNumber::ToVar(k, scriptContext),
                                obj);
                    }
                    END_SAFE_REENTRANT_CALL
                );

                    if (newArr && isBuiltinArrayCtor)
                    {
                        newArr->SetItem((uint32)k, mappedValue, PropertyOperation_None);
                    }
                    else
                    {
                        JS_REENTRANT(jsReentLock, ThrowErrorOnFailure(JavascriptArray::SetArrayLikeObjects(newObj, BigIndex(k), mappedValue), scriptContext, BigIndex(k)));
                    }
            }
        }

#ifdef VALIDATE_ARRAY
        if (JavascriptArray::IsNonES5Array(newObj))
        {
            newArr->ValidateArray();
        }
#endif

        return newObj;
    }